

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.hpp
# Opt level: O3

void __thiscall
ddd::DaTrie<true,_true,_true>::edge_
          (DaTrie<true,_true,_true> *this,uint32_t node_pos,Edge *edge,size_t upper)

{
  uint8_t uVar1;
  Bc BVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pNVar5;
  pointer pNVar6;
  ulong uVar7;
  
  edge->size_ = 0;
  BVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
          super__Vector_impl_data._M_start[node_pos];
  uVar3 = (ulong)BVar2 & 0x7fffffff;
  if (uVar3 != 0x7fffffff && -1 < BVar2._0_4_) {
    uVar1 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
            _M_impl.super__Vector_impl_data._M_start[node_pos].child;
    edge->size_ = 1;
    edge->labels_[0] = uVar1;
    if (1 < upper) {
      pNVar5 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pNVar6 = pNVar5 + node_pos;
      uVar4 = 1;
      do {
        uVar7 = pNVar6->child ^ uVar3;
        uVar1 = pNVar5[uVar7].sib;
        if (uVar1 == pNVar5[node_pos].child) {
          return;
        }
        edge->size_ = uVar4 + 1;
        edge->labels_[uVar4] = uVar1;
        pNVar5 = (this->node_links_).
                 super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pNVar6 = (pointer)&pNVar5[uVar7].sib;
        uVar4 = edge->size_;
      } while (uVar4 < upper);
    }
  }
  return;
}

Assistant:

size_t size() const { return size_; }